

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_def.c
# Opt level: O3

int count_exts_in_msg(google_protobuf_DescriptorProto *msg_proto)

{
  anon_union_8_2_9eb4e620_for_upb_Message_0 aVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  if ((anon_union_8_2_9eb4e620_for_upb_Message_0)
      ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg_proto + 8))->internal_opaque ==
      (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = *(int *)(((anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg_proto + 8))->internal_opaque
                    + 8);
  }
  aVar1 = (anon_union_8_2_9eb4e620_for_upb_Message_0)
          ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg_proto + 5))->internal_opaque;
  if ((aVar1 != (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) &&
     (uVar2 = *(ulong *)(aVar1.internal_opaque + 8), uVar2 != 0)) {
    uVar3 = *(ulong *)aVar1;
    uVar6 = 0;
    do {
      iVar4 = count_exts_in_msg(*(google_protobuf_DescriptorProto **)
                                 ((uVar3 & 0xfffffffffffffff8) + uVar6 * 8));
      iVar5 = iVar5 + iVar4;
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  return iVar5;
}

Assistant:

static int count_exts_in_msg(const UPB_DESC(DescriptorProto) * msg_proto) {
  size_t n;
  UPB_DESC(DescriptorProto_extension)(msg_proto, &n);
  int ext_count = n;

  const UPB_DESC(DescriptorProto)* const* nested_msgs =
      UPB_DESC(DescriptorProto_nested_type)(msg_proto, &n);
  for (size_t i = 0; i < n; i++) {
    ext_count += count_exts_in_msg(nested_msgs[i]);
  }

  return ext_count;
}